

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_srtp.cc
# Opt level: O3

int ssl_ctx_make_profiles
              (char *profiles_string,UniquePtr<struct_stack_st_SRTP_PROTECTION_PROFILE> *out)

{
  _Head_base<0UL,_stack_st_SRTP_PROTECTION_PROFILE_*,_false> __p;
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  char *__s;
  size_t __n;
  SRTP_PROTECTION_PROFILE *p;
  SRTP_PROTECTION_PROFILE *pSVar5;
  UniquePtr<struct_stack_st_SRTP_PROTECTION_PROFILE> profiles;
  _Head_base<0UL,_stack_st_SRTP_PROTECTION_PROFILE_*,_false> local_40;
  __uniq_ptr_impl<stack_st_SRTP_PROTECTION_PROFILE,_bssl::internal::Deleter> *local_38;
  
  local_40._M_head_impl = (stack_st_SRTP_PROTECTION_PROFILE *)OPENSSL_sk_new_null();
  if ((OPENSSL_STACK *)local_40._M_head_impl == (OPENSSL_STACK *)0x0) {
    iVar1 = 0;
    ERR_put_error(0x10,0,0xd3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_srtp.cc"
                  ,0x3d);
  }
  else {
    local_38 = (__uniq_ptr_impl<stack_st_SRTP_PROTECTION_PROFILE,_bssl::internal::Deleter> *)out;
    do {
      __s = "SRTP_AES128_CM_SHA1_80";
      pcVar2 = strchr(profiles_string,0x3a);
      pSVar5 = kSRTPProfiles;
      if (pcVar2 == (char *)0x0) {
        __n = strlen(profiles_string);
      }
      else {
        __n = (long)pcVar2 - (long)profiles_string;
      }
      while ((sVar3 = strlen(__s), sVar3 != __n ||
             (iVar1 = strncmp(__s,profiles_string,__n), iVar1 != 0))) {
        __s = pSVar5[1].name;
        pSVar5 = pSVar5 + 1;
        if (__s == (char *)0x0) {
          iVar1 = 0;
          ERR_put_error(0x10,0,0xd4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_srtp.cc"
                        ,0x49);
          goto LAB_00130f7c;
        }
      }
      sVar4 = OPENSSL_sk_push((OPENSSL_STACK *)local_40._M_head_impl,pSVar5);
      __p._M_head_impl = local_40._M_head_impl;
      if (sVar4 == 0) {
        iVar1 = 0;
        goto LAB_00130f7c;
      }
      profiles_string = pcVar2 + 1;
    } while (pcVar2 != (char *)0x0);
    local_40._M_head_impl = (stack_st_SRTP_PROTECTION_PROFILE *)0x0;
    std::__uniq_ptr_impl<stack_st_SRTP_PROTECTION_PROFILE,_bssl::internal::Deleter>::reset
              (local_38,__p._M_head_impl);
    iVar1 = 1;
  }
LAB_00130f7c:
  std::unique_ptr<stack_st_SRTP_PROTECTION_PROFILE,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<stack_st_SRTP_PROTECTION_PROFILE,_bssl::internal::Deleter> *)&local_40);
  return iVar1;
}

Assistant:

static int ssl_ctx_make_profiles(
    const char *profiles_string,
    UniquePtr<STACK_OF(SRTP_PROTECTION_PROFILE)> *out) {
  UniquePtr<STACK_OF(SRTP_PROTECTION_PROFILE)> profiles(
      sk_SRTP_PROTECTION_PROFILE_new_null());
  if (profiles == nullptr) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_SRTP_COULD_NOT_ALLOCATE_PROFILES);
    return 0;
  }

  const char *col;
  const char *ptr = profiles_string;
  do {
    col = strchr(ptr, ':');

    const SRTP_PROTECTION_PROFILE *profile;
    if (!find_profile_by_name(ptr, &profile,
                              col ? (size_t)(col - ptr) : strlen(ptr))) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_SRTP_UNKNOWN_PROTECTION_PROFILE);
      return 0;
    }

    if (!sk_SRTP_PROTECTION_PROFILE_push(profiles.get(), profile)) {
      return 0;
    }

    if (col) {
      ptr = col + 1;
    }
  } while (col);

  *out = std::move(profiles);
  return 1;
}